

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

set<int,_std::less<int>,_std::allocator<int>_> * __thiscall
Centaurus::NFA<char>::epsilon_closure
          (set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,NFA<char> *this,
          int index,bool *long_flag)

{
  bool bVar1;
  bool *long_flag_local;
  int index_local;
  NFA<char> *this_local;
  set<int,_std::less<int>,_std::allocator<int>_> *ret;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(__return_storage_ptr__);
  bVar1 = epsilon_closure_sub(this,__return_storage_ptr__,index);
  *long_flag = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::set<int> epsilon_closure(int index, bool& long_flag) const
    {
        std::set<int> ret;

        long_flag = epsilon_closure_sub(ret, index);

        return ret;
    }